

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  bool bVar1;
  deUint32 queueFamilyIndex_;
  iterator beg;
  iterator end;
  VkAllocationCallbacks *pVVar2;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  reference this;
  char **value;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  char *local_578;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  allocator<char> local_529;
  string local_528;
  Handle<(vk::HandleType)22> local_508;
  uint local_500;
  int local_4fc;
  deUint32 nullNdx;
  undefined1 local_378 [8];
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  scopedHandles;
  Resources res;
  MessageBuilder local_2d0;
  undefined1 local_150 [8];
  Environment objEnv;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  VkResult local_58 [2];
  VkResult result;
  allocator<vk::Handle<(vk::HandleType)22>_> local_41;
  undefined1 local_40 [8];
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_> handles;
  deUint32 numPassingAllocs;
  bool expectNullHandles;
  Parameters *params_local;
  Context *context_local;
  
  handles.
  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       api::(anonymous_namespace)::isNullHandleOnAllocationFailure<vk::Handle<(vk::HandleType)22>>
                 (context);
  handles.
  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::allocator<vk::Handle<(vk::HandleType)22>_>::allocator(&local_41);
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_> *
         )local_40,4,&local_41);
  std::allocator<vk::Handle<(vk::HandleType)22>_>::~allocator(&local_41);
  local_58[0] = VK_NOT_READY;
  do {
    if (4 < (uint)handles.
                  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00802b79:
      local_4fc = 0;
LAB_00802b83:
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::~vector((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                 *)local_40);
      if (local_4fc == 0) {
        if ((uint)handles.
                  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
          bVar1 = api::(anonymous_namespace)::isPooledObject<vk::Handle<(vk::HandleType)22>>();
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5c0,
                       "Not validated: pooled objects didn\'t seem to use host memory",&local_5c1);
            tcu::TestStatus::pass(__return_storage_ptr__,&local_5c0);
            std::__cxx11::string::~string((string *)&local_5c0);
            std::allocator<char>::~allocator(&local_5c1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5e8,"Allocation callbacks not called",&local_5e9);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_5e8);
            std::__cxx11::string::~string((string *)&local_5e8);
            std::allocator<char>::~allocator(&local_5e9);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"Ok",&local_611);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_610);
          std::__cxx11::string::~string((string *)&local_610);
          std::allocator<char>::~allocator(&local_611);
        }
      }
      return __return_storage_ptr__;
    }
    beg = std::
          vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
          begin((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                 *)local_40);
    end = std::
          vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
          end((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
               *)local_40);
    ::vk::ValidateQueryBits::
    fillBits<__gnu_cxx::__normal_iterator<vk::Handle<(vk::HandleType)22>*,std::vector<vk::Handle<(vk::HandleType)22>,std::allocator<vk::Handle<(vk::HandleType)22>>>>>
              ((__normal_iterator<vk::Handle<(vk::HandleType)22>_*,_std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>_>
                )beg._M_current,
               (__normal_iterator<vk::Handle<(vk::HandleType)22>_*,_std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>_>
                )end._M_current,0xde);
    pVVar2 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,pVVar2,MODE_DO_NOT_COUNT,0);
    pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&recorder.m_records.m_last);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar2,0x80);
    vkp_ = Context::getPlatformInterface(context);
    vkd_ = Context::getDeviceInterface(context);
    device_ = Context::getDevice(context);
    queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
    programBinaries_ = Context::getBinaryCollection(context);
    pVVar2 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
    Environment::Environment
              ((Environment *)local_150,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar2,
               4);
    pTVar3 = Context::getTestContext(context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_2d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [18])"Trying to create ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,&allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::DescriptorSet>
                                ::numObjects);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])" objects with ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(uint *)&handles.
                                        super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" allocation");
    res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x12f6f83;
    if ((uint)handles.
              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != 1) {
      res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x13bf3a6;
    }
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char **)&res.descriptorSetLayout.object.
                                         super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                                         deleter.m_allocator);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])" passing");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d0);
    DescriptorSet::Resources::Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Environment *)local_150,params);
    ::vk::DeterministicFailAllocator::reset
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,MODE_COUNT_AND_FAIL,
               (uint)handles.
                     super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    DescriptorSet::createMultiple
              ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
                *)local_378,(Environment *)local_150,
               (Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,params,
               (vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                *)local_40,local_58);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
               *)local_378);
    DescriptorSet::Resources::~Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_58[0] == VK_SUCCESS) {
      pTVar3 = Context::getTestContext(context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&nullNdx,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&nullNdx,
                          (char (*) [40])"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&nullNdx);
      local_4fc = 2;
    }
    else {
      if ((handles.
           super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        for (local_500 = (uint)handles.
                               super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_500 < 4;
            local_500 = local_500 + 1) {
          this = std::
                 vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                 ::operator[]((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                               *)local_40,(ulong)local_500);
          ::vk::Handle<(vk::HandleType)22>::Handle(&local_508,0);
          bVar1 = ::vk::Handle<(vk::HandleType)22>::operator!=(this,&local_508);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_528,"Some object handles weren\'t set to NULL",&local_529);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_528);
            std::__cxx11::string::~string((string *)&local_528);
            std::allocator<char>::~allocator(&local_529);
            local_4fc = 1;
            goto LAB_00802b15;
          }
        }
      }
      if (local_58[0] == VK_ERROR_OUT_OF_HOST_MEMORY) {
        pTVar3 = Context::getTestContext(context);
        pTVar4 = tcu::TestContext::getLog(pTVar3);
        bVar1 = ::vk::validateAndLog
                          (pTVar4,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
        if (bVar1) {
          local_4fc = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_598,"Invalid allocation callback",&local_599);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_598);
          std::__cxx11::string::~string((string *)&local_598);
          std::allocator<char>::~allocator(&local_599);
          local_4fc = 1;
        }
      }
      else {
        local_578 = ::vk::getResultName(local_58[0]);
        de::toString<char_const*>(&local_570,(de *)&local_578,value);
        std::operator+(&local_550,"Got invalid error code: ",&local_570);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_570);
        local_4fc = 1;
      }
    }
LAB_00802b15:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last);
    if (local_4fc != 0) {
      if (local_4fc != 2) goto LAB_00802b83;
      goto LAB_00802b79;
    }
    handles.
    super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)handles.
               super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}